

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall Rml::DataViewText::Release(DataViewText *this)

{
  DataViewText *this_local;
  
  if (this != (DataViewText *)0x0) {
    ~DataViewText(this);
    operator_delete(this,0x50);
  }
  return;
}

Assistant:

void DataViewText::Release()
{
	delete this;
}